

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNAnonFunc::gen_code(CTPNAnonFunc *this,int discard,int param_2)

{
  int iVar1;
  uint uVar2;
  CTcCodeBodyCtx *pCVar3;
  CTcGenTarg *pCVar4;
  int iVar5;
  undefined8 in_RAX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  CTcCodeBodyCtx **ppCVar6;
  uint uVar7;
  undefined8 uStack_38;
  int our_varnum;
  
  if (discard != 0) {
    return;
  }
  uVar7 = 0;
  ppCVar6 = &(((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).ctx_tail_;
  uStack_38 = in_RAX;
  while (pCVar3 = *ppCVar6, pCVar3 != (CTcCodeBodyCtx *)0x0) {
    iVar5 = CTPNCodeBodyBase::get_ctx_var_for_level
                      (&G_cs->code_body_->super_CTPNCodeBodyBase,pCVar3->level_ + -1,&our_varnum);
    if (iVar5 == 0) {
      if (((((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).field_0xb9 & 4) !=
          0) {
        CTcGenTarg::write_op(G_cg,'\b');
        pCVar4 = G_cg;
        iVar1 = G_cg->sp_depth_;
        iVar5 = iVar1 + 1;
        G_cg->sp_depth_ = iVar5;
        if (pCVar4->max_sp_depth_ <= iVar1) {
          pCVar4->max_sp_depth_ = iVar5;
        }
      }
    }
    else {
      CTcSymLocal::s_gen_code_getlcl(our_varnum,0);
    }
    uVar7 = uVar7 + 1;
    ppCVar6 = &pCVar3->prv_;
  }
  if ((G_cg->field_0xd0 & 4) == 0) {
    CTcGenTarg::write_op(G_cg,'\v');
    CTPNCodeBodyBase::add_abs_fixup
              (&((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase,
               &G_cs->super_CTcDataStream);
    CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
  }
  else {
    CTcGenTarg::write_op(G_cg,'\a');
    CTcDataStream::write_obj_id
              (&G_cs->super_CTcDataStream,
               (ulong)(((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).
                      super_CTPNStmTop.dyn_obj_id_);
  }
  pCVar4 = G_cg;
  uVar2 = G_cg->sp_depth_;
  __n = (size_t)uVar2;
  G_cg->sp_depth_ = uVar2 + 1;
  if (pCVar4->max_sp_depth_ <= (int)uVar2) {
    pCVar4->max_sp_depth_ = uVar2 + 1;
  }
  if (uVar7 == 0) {
    if (((((this->super_CTPNAnonFuncBase).code_body_)->super_CTPNCodeBodyBase).field_0xb8 & 8) == 0)
    {
      return;
    }
  }
  else if (0xfe < uVar7) {
    CTcGenTarg::write_op(pCVar4,0xc1);
    CTcDataStream::write2(&G_cs->super_CTcDataStream,uVar7 + 1);
    CTcDataStream::write2(&G_cs->super_CTcDataStream,G_cg->predef_meta_idx_[5]);
    goto LAB_002467ef;
  }
  CTcGenTarg::write_op(pCVar4,0xc0);
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)(uVar7 + 1),__buf,__n);
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)G_cg->predef_meta_idx_[5],__buf_00,__n)
  ;
LAB_002467ef:
  CTcGenTarg::write_op(G_cg,0x8b);
  G_cg->sp_depth_ = G_cg->sp_depth_ - uVar7;
  return;
}

Assistant:

void CTPNAnonFunc::gen_code(int discard, int)
{
    /* if we're discarding the value, don't bother generating the code */
    if (discard)
        return;

    /* 
     *   Push each context object - these are the additional arguments to
     *   the anonymous function pointer object's constructor beyond the
     *   function pointer itself.  Note that we must push the arguments in
     *   reverse order of our list, since arguments are always pushed from
     *   last to first.  
     */
    int argc = 0;
    for (CTcCodeBodyCtx *cur_ctx = code_body_->get_ctx_tail() ; cur_ctx != 0 ;
         cur_ctx = cur_ctx->prv_, ++argc)
    {
        /* 
         *   find our context matching this context - the caller's
         *   contexts are all one level lower than the callee's contexts,
         *   because the caller is at the next recursion level out 
         */
        int our_varnum;
        if (G_cs->get_code_body()
            ->get_ctx_var_for_level(cur_ctx->level_ - 1, &our_varnum))
        {
			/* 
			 *   push this context object - to do this, simply retrieve the
			 *   value of the local variable in our frame that contains this
			 *   context level 
			 */
			CTcSymLocal::s_gen_code_getlcl(our_varnum, FALSE);
		}
		else if (code_body_->is_anon_method())
		{
			/* 
			 *   anonymous methods don't use context variables, since they
			 *   use the live method context 
			 */
			G_cg->write_op(OPC_PUSHNIL);
			G_cg->note_push();
		}
		else
		{
			/* 
			 *   If this is an anonymous function (rather than an anonymous
			 *   method), we require the context variable.  Anonymous methods
			 *   don't use these.
			 */
			assert(FALSE);
		}
    }

    /* 
     *   The first argument (and thus last pushed) to the constructor is the
     *   constant function pointer that refers to the code of the anonymous
     *   function.
     *   
     *   For regular static compilation, the function pointer is a simple
     *   code offset constant.  For run-time compilation (in the debugger or
     *   interpreter "eval()" facility), it's a DynamicFunc representing the
     *   dynamically compiled code.  
     */
    if (G_cg->is_eval_for_dyn())
    {
        /* 
         *   Dynamic (run-time) compilation - the bytecode is in a
         *   dynamically created DynamicFunc instance.  The dynamic compiler
         *   assigns object IDs for the anonymous function code body before
         *   generating any code for any referencing object, so we simply
         *   generate a PUSHOBJ for the code body's object ID. 
         */
        G_cg->write_op(OPC_PUSHOBJ);
        G_cs->write_obj_id(code_body_->get_dyn_obj_id());
    }
    else
    {
        /* conventional static compiler - the bytecode is in the code pool */
        G_cg->write_op(OPC_PUSHFNPTR);
        code_body_->add_abs_fixup(G_cs);
        G_cs->write4(0);
    }

    /* count the argument */
    ++argc;

    /* note the push of the function pointer argument */
    G_cg->note_push();

    /*
     *   If we have a local context, we need to create an anonymous function
     *   metaclass object that combines the function pointer with the local
     *   context.  If we don't have a local context, this is a simple static
     *   function that we can call directly, in which case we're already done
     *   since we've pushed the function pointer.  
     */
    if (argc > 1 || code_body_->has_local_ctx())
    {
        /* 
         *   We have a local context, so we need create to create the
         *   anonymous function metaclass object.  Generate the NEW.  
         */
        if (argc <= 255)
        {
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)argc);
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_ANONFN));
        }
        else
        {
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(argc);
            G_cs->write2(G_cg->get_predef_meta_idx(TCT3_METAID_ANONFN));
        }
        
        /* push the object value */
        G_cg->write_op(OPC_GETR0);

        /* the 'new' popped the arguments, then we pushed the result */
        G_cg->note_pop(argc - 1);
    }
}